

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCapsuleShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtCapsuleShape::localGetSupportingVertexWithoutMargin(cbtCapsuleShape *this,cbtVector3 *vec0)

{
  cbtScalar cVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  cbtVector3 cVar11;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_14;
  float local_10;
  float local_c;
  
  local_c = vec0->m_floats[0];
  local_10 = vec0->m_floats[1];
  local_14 = vec0->m_floats[2];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_10 * local_10)),ZEXT416((uint)local_c),
                           ZEXT416((uint)local_c));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_14),ZEXT416((uint)local_14));
  fVar5 = auVar8._0_4_;
  if (0.0001 <= fVar5) {
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar5 = auVar8._0_4_;
    }
    fVar5 = 1.0 / fVar5;
    auVar8 = ZEXT416((uint)(local_c * fVar5));
    fVar9 = local_10 * fVar5;
    auVar10 = ZEXT416((uint)(local_14 * fVar5));
  }
  else {
    fVar9 = 0.0;
    auVar8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar10._0_12_ = ZEXT812(0);
    auVar10._12_4_ = 0;
  }
  local_28 = 0;
  uStack_20 = 0;
  lVar3 = (long)*(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  cVar1 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[lVar3];
  *(cbtScalar *)((long)&local_28 + lVar3 * 4) = cVar1;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_28._4_4_)),auVar8,ZEXT416((uint)local_28));
  auVar2 = vfmadd231ss_fma(auVar2,auVar10,ZEXT416((uint)uStack_20));
  uVar6 = local_28;
  uVar7 = uStack_20;
  if (auVar2._0_4_ <= -1e+18) {
    uVar6 = 0;
    uVar7 = 0;
  }
  auVar2 = vmaxss_avx(auVar2,SUB6416(ZEXT464(0xdd5e0b6b),0));
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(ZEXT416((uint)cVar1),auVar4);
  local_28 = 0;
  uStack_20 = 0;
  *(int *)((long)&local_28 + lVar3 * 4) = auVar4._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_28._4_4_)),auVar8,ZEXT416((uint)local_28));
  auVar8 = vfmadd231ss_fma(auVar8,auVar10,ZEXT416((uint)uStack_20));
  if (auVar2._0_4_ < auVar8._0_4_) {
    uVar6 = local_28;
    uVar7 = uStack_20;
  }
  cVar11.m_floats[2] = (cbtScalar)(int)uVar7;
  cVar11.m_floats[3] = (cbtScalar)(int)((ulong)uVar7 >> 0x20);
  cVar11.m_floats[0] = (cbtScalar)(int)uVar6;
  cVar11.m_floats[1] = (cbtScalar)(int)((ulong)uVar6 >> 0x20);
  return (cbtVector3)cVar11.m_floats;
}

Assistant:

cbtVector3 cbtCapsuleShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);

	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		cbtVector3 pos(0, 0, 0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos;
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;
}